

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.c
# Opt level: O1

char ** strchrexplode(char *strP,char sep)

{
  code *pcVar1;
  char cVar2;
  uint uVar3;
  char *__s;
  char **__s_00;
  size_t sVar5;
  char *pcVar6;
  char cVar7;
  long lVar8;
  long lVar9;
  char *pcVar10;
  int iVar4;
  
  if (strP == (char *)0x0) {
    __s_00 = (char **)0x0;
  }
  else {
    __s = strdup(strP);
    if (*__s == '\0') {
      __s_00 = (char **)0x0;
    }
    else {
      lVar9 = 0;
      cVar2 = *__s;
      pcVar10 = __s;
      do {
        cVar7 = cVar2;
        lVar8 = lVar9;
        pcVar10 = pcVar10 + 1;
        lVar9 = (ulong)(cVar7 == sep) + lVar8;
        cVar2 = *pcVar10;
      } while (*pcVar10 != '\0');
      sVar5 = lVar9 * 8 + 0x10;
      __s_00 = (char **)malloc(sVar5);
      memset(__s_00,0,sVar5);
      sVar5 = strlen(__s);
      uVar3 = (uint)sVar5;
      pcVar10 = __s;
      while (uVar3 != 0) {
        if (*pcVar10 == sep) {
          *pcVar10 = '\0';
        }
        iVar4 = (int)sVar5;
        uVar3 = iVar4 - 1;
        sVar5 = (size_t)uVar3;
        if (SBORROW4(iVar4,1)) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        pcVar10 = pcVar10 + 1;
      }
      if (lVar9 != -1) {
        lVar9 = 0;
        pcVar10 = __s;
        do {
          if (*pcVar10 == '\0') {
            pcVar6 = (char *)malloc(1);
            __s_00[lVar9] = pcVar6;
            *pcVar6 = '\0';
          }
          else {
            pcVar6 = strdup(pcVar10);
            __s_00[lVar9] = pcVar6;
          }
          sVar5 = strlen(pcVar10);
          pcVar10 = pcVar10 + sVar5 + 1;
          lVar9 = lVar9 + 1;
        } while (lVar8 + 1 + (ulong)(cVar7 == sep) != lVar9);
      }
    }
    free(__s);
  }
  return __s_00;
}

Assistant:

char ** strchrexplode(char * strP, char sep)
{
	unsigned long   count, i;
	char **         array;
	char *          str;
	char *          originalstr;

	if(!strP)
		return 0;

	str = strdup(strP);
	originalstr = str;

	if(strlen(str)==0)
	{
		strfree(originalstr);
		return 0;
	}

	count = strchrcount(str, sep)+1;

	array = (char **)malloc(sizeof(char *)*(count+1));
	memset(array, 0, (sizeof(char *)*(count+1)));

	strchrrep(str, sep, '\0');

	for(i=0;i<count;i++)
	{
		if(!strlen(str))
		{
			array[i] = (char *)malloc(1);
			array[i][0] = '\0';
		}
		else
		   array[i] = strdup(str);

		str = str+strlen(str)+1;
	}

	free(originalstr);

	return array;
}